

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

path * boost::filesystem::detail::current_path(path *__return_storage_ptr__,error_code *ec)

{
  bool bVar1;
  char *pcVar2;
  int *piVar3;
  err_t local_5c;
  scoped_array<char> local_30;
  scoped_array<char> buf;
  long path_max;
  error_code *ec_local;
  path *cur;
  
  filesystem::path::path(__return_storage_ptr__);
  buf.px = (char *)0x80;
  while( true ) {
    pcVar2 = (char *)operator_new__(buf.px);
    scoped_array<char>::scoped_array(&local_30,pcVar2);
    pcVar2 = scoped_array<char>::get(&local_30);
    pcVar2 = getcwd(pcVar2,buf.px);
    if (pcVar2 == (char *)0x0) {
      piVar3 = __errno_location();
      if (*piVar3 == 0x22) {
        local_5c = 0;
      }
      else {
        piVar3 = __errno_location();
        local_5c = *piVar3;
      }
      bVar1 = anon_unknown.dwarf_522f::error(local_5c,ec,"boost::filesystem::current_path");
      if (bVar1) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    else {
      pcVar2 = scoped_array<char>::get(&local_30);
      filesystem::path::operator=(__return_storage_ptr__,pcVar2);
      if (ec != (error_code *)0x0) {
        system::error_code::clear(ec);
      }
      bVar1 = true;
    }
    scoped_array<char>::~scoped_array(&local_30);
    if (bVar1) break;
    buf.px = buf.px << 1;
  }
  return __return_storage_ptr__;
}

Assistant:

BOOST_FILESYSTEM_DECL
  path current_path(error_code* ec)
  {
#   ifdef BOOST_POSIX_API
    path cur;
    for (long path_max = 128;; path_max *=2)// loop 'til buffer large enough
    {
      boost::scoped_array<char>
        buf(new char[static_cast<std::size_t>(path_max)]);
      if (::getcwd(buf.get(), static_cast<std::size_t>(path_max))== 0)
      {
        if (error(errno != ERANGE ? errno : 0
      // bug in some versions of the Metrowerks C lib on the Mac: wrong errno set 
#         if defined(__MSL__) && (defined(macintosh) || defined(__APPLE__) || defined(__APPLE_CC__))
          && errno != 0
#         endif
          , ec, "boost::filesystem::current_path"))
        {
          break;
        }
      }
      else
      {
        cur = buf.get();
        if (ec != 0) ec->clear();
        break;
      }
    }
    return cur;

#   else
    DWORD sz;
    if ((sz = ::GetCurrentDirectoryW(0, NULL)) == 0)sz = 1;
    boost::scoped_array<path::value_type> buf(new path::value_type[sz]);
    error(::GetCurrentDirectoryW(sz, buf.get()) == 0 ? BOOST_ERRNO : 0, ec,
      "boost::filesystem::current_path");
    return path(buf.get());
#   endif
  }